

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O0

void __thiscall Item::PrintItem(Item *this)

{
  ostream *poVar1;
  Item *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Cost: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cost);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Item Type: ");
  if (this->typeI == KATANA) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Katana");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeI == SPEAR) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Spear");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeI == BOW) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Bow");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeI == NINJATO) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Ninjato");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (this->typeI != WAKIZASHI) {
      return;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Wakizashi");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((this->tapped & 1U) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Tapped: no");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Tapped: yes");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Attack: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->attackBonus);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Defense: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->defenseBonus);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Minimum Honor Required: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->minimumHonor);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Effect Bonus: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->effectBonus);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Effect Cost: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->effectCost);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Card text: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->cardText);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Durability: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->durability);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Item::PrintItem()                  //prints item's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << cost << endl;

    cout << "Item Type: ";
    if (typeI == KATANA)
        cout << "Katana"<< endl;
    else if (typeI == SPEAR)
        cout << "Spear"<< endl;
    else if (typeI == BOW)
        cout << "Bow"<< endl;
    else if (typeI == NINJATO)
        cout << "Ninjato"<< endl;
    else if (typeI == WAKIZASHI)
        cout << "Wakizashi"<< endl;
    else return;

    if (tapped)
        cout << "Tapped: yes"<<endl;
    else
        cout <<"Tapped: no"<<endl;

    cout << "Attack: " << attackBonus << endl;
    cout << "Defense: " << defenseBonus << endl;
    cout << "Minimum Honor Required: " << minimumHonor << endl;

    cout << "Effect Bonus: " << effectBonus << endl;
    cout << "Effect Cost: " << effectCost << endl;

    cout << "Card text: " << cardText << endl;

    cout << "Durability: "<<durability<<endl;
    cout << endl;
}